

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::OutputFile::updatePreviewImage(OutputFile *this,PreviewRgba *newPixels)

{
  PreviewRgba *pPVar1;
  OStream *pOVar2;
  int iVar3;
  TypedAttribute<Imf_2_5::PreviewImage> *pTVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  char *pcVar6;
  LogicExc *this_00;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  Lock local_1b0;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  local_1b0._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1b0._mutex);
  local_1b0._locked = true;
  if (this->_data->previewPosition != 0) {
    pTVar4 = Header::typedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::PreviewImage>>
                       (&this->_data->header,"preview");
    pPVar1 = (pTVar4->_value)._pixels;
    uVar7 = (pTVar4->_value)._height * (pTVar4->_value)._width;
    uVar9 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      pPVar1[uVar9] = newPixels[uVar9];
    }
    iVar3 = (*this->_data->_streamData->os->_vptr_OStream[3])();
    pOVar2 = this->_data->_streamData->os;
    (*pOVar2->_vptr_OStream[4])(pOVar2,this->_data->previewPosition);
    (*(pTVar4->super_Attribute)._vptr_Attribute[4])
              (pTVar4,this->_data->_streamData->os,(ulong)(uint)this->_data->version);
    pOVar2 = this->_data->_streamData->os;
    (*pOVar2->_vptr_OStream[4])(pOVar2,CONCAT44(extraout_var,iVar3));
    IlmThread_2_5::Lock::~Lock(&local_1b0);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar5 = std::operator<<(local_190,"Cannot update preview image pixels. File \"");
  pcVar6 = fileName(this);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\" does not contain a preview image.");
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::LogicExc::LogicExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
}

Assistant:

void
OutputFile::updatePreviewImage (const PreviewRgba newPixels[])
{
    Lock lock (*_data->_streamData);

    if (_data->previewPosition <= 0)
	THROW (IEX_NAMESPACE::LogicExc, "Cannot update preview image pixels. "
			      "File \"" << fileName() << "\" does not "
			      "contain a preview image.");

    //
    // Store the new pixels in the header's preview image attribute.
    //

    PreviewImageAttribute &pia =
	_data->header.typedAttribute <PreviewImageAttribute> ("preview");

    PreviewImage &pi = pia.value();
    PreviewRgba *pixels = pi.pixels();
    int numPixels = pi.width() * pi.height();

    for (int i = 0; i < numPixels; ++i)
	pixels[i] = newPixels[i];

    //
    // Save the current file position, jump to the position in
    // the file where the preview image starts, store the new
    // preview image, and jump back to the saved file position.
    //

    Int64 savedPosition = _data->_streamData->os->tellp();

    try
    {
        _data->_streamData->os->seekp (_data->previewPosition);
	pia.writeValueTo (*_data->_streamData->os, _data->version);
	_data->_streamData->os->seekp (savedPosition);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Cannot update preview image pixels for "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}